

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp_test.cpp
# Opt level: O0

void __thiscall FASTEXP_PowerZero_Test::TestBody(FASTEXP_PowerZero_Test *this)

{
  initializer_list<long_long> __l;
  initializer_list<long_long> __l_00;
  bool bVar1;
  char *message;
  AssertHelper local_d0;
  Message local_c8;
  allocator<long_long> local_b9;
  longlong local_b8 [3];
  iterator local_a0;
  size_type local_98;
  vector<long_long,_std::allocator<long_long>_> local_90;
  allocator<long_long> local_61;
  ll local_60;
  ll local_58;
  ll local_50;
  iterator local_48;
  size_type local_40;
  vector<long_long,_std::allocator<long_long>_> local_38;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FASTEXP_PowerZero_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_60 = fastexp(1,0,5);
  local_58 = fastexp(10,0,0xf585);
  local_50 = fastexp(0x4a59b7bd,0,0x1f33dbf6);
  local_48 = &local_60;
  local_40 = 3;
  std::allocator<long_long>::allocator(&local_61);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_38,__l_00,&local_61);
  local_b8[0] = 1;
  local_b8[1] = 1;
  local_b8[2] = 1;
  local_a0 = local_b8;
  local_98 = 3;
  std::allocator<long_long>::allocator(&local_b9);
  __l._M_len = local_98;
  __l._M_array = local_a0;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_90,__l,&local_b9);
  testing::internal::EqHelper<false>::
  Compare<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((EqHelper<false> *)local_20,
             "(vector<ll> {fastexp(1, 0, 5), fastexp(10, 0, 62853), fastexp(1247393725, 0, 523492342)})"
             ,"(vector<ll> {1, 1, 1})",&local_38,&local_90);
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_90);
  std::allocator<long_long>::~allocator(&local_b9);
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_38);
  std::allocator<long_long>::~allocator(&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/fastexp_test.cpp"
               ,10,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(FASTEXP, PowerZero) {
	EXPECT_EQ((vector<ll> {fastexp(1, 0, 5), fastexp(10, 0, 62853), fastexp(1247393725, 0, 523492342)}), (vector<ll> {1, 1, 1}));
}